

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

void __thiscall
CCharmapToUniMB::set_mapping(CCharmapToUniMB *this,wchar_t uni_code_pt,wchar_t param_2)

{
  undefined8 *puVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  
  if (param_2 < L'Ā') {
    *(wchar_t *)((long)&this->map_[0].ch + (ulong)(uint)((param_2 & 0xffU) << 4)) = uni_code_pt;
  }
  else {
    uVar3 = (ulong)((uint)param_2 >> 4 & 0xff0);
    pvVar2 = *(void **)((long)&this->map_[0].sub + uVar3);
    if (pvVar2 == (void *)0x0) {
      pvVar2 = malloc(0x400);
      *(void **)((long)&this->map_[0].sub + uVar3) = pvVar2;
      lVar4 = 0;
      do {
        puVar1 = (undefined8 *)((long)pvVar2 + lVar4 * 4);
        *puVar1 = 0xfffd0000fffd;
        puVar1[1] = 0xfffd0000fffd;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x100);
    }
    *(wchar_t *)((long)pvVar2 + (ulong)(uint)(param_2 & 0xff) * 4) = uni_code_pt;
  }
  return;
}

Assistant:

void CCharmapToUniMB::set_mapping(wchar_t uni_code_pt, wchar_t local_code_pt)
{
    /* 
     *   Check to see if it's a one-byte or two-byte mapping.  If the local
     *   code point is in the range 0-255, it's a one-byte character;
     *   otherwise, it's a two-byte character.  
     */
    if (local_code_pt <= 255)
    {
        /* it's a single-byte character, so simply set the mapping */
        map_[(unsigned char)local_code_pt].ch = uni_code_pt;
    }
    else
    {
        cmap_mb_entry *entp;
        wchar_t *subp;

        /* 
         *   Get the mapping table entry for the lead byte.  The lead byte of
         *   the local code point is given by the high-order byte of the
         *   local code point.  (Note that this doesn't have anything to do
         *   with the endian-ness of the local platform.  The generic Unicode
         *   mapping tables are specifically designed this way, independently
         *   of endian-ness.)  
         */
        entp = &map_[(unsigned char)((local_code_pt >> 8) & 0xff)];

        /* 
         *   It's a two-byte character.  The high-order byte is the lead
         *   byte, and the low-order byte is the trailing byte of the
         *   two-byte sequence.  
         *   
         *   If we haven't previously set up a sub-table for the lead byte,
         *   do so now.  
         */
        if ((subp = entp->sub) == 0)
        {
            size_t i;
            wchar_t *p;

            /* allocate a new sub-mapping table for the lead byte */
            subp = entp->sub = (wchar_t *)t3malloc(256 * sizeof(wchar_t));

            /* initialize each entry to U+FFFD, in case we never map them */
            for (i = 256, p = subp ; i != 0 ; --i, *p++ = 0xFFFD) ;
        }

        /* set the mapping in the sub-table for the second byte */
        subp[(unsigned char)(local_code_pt & 0xff)] = uni_code_pt;
    }
}